

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.hpp
# Opt level: O0

void __thiscall
vk::ProgramCollection<glu::ProgramSources>::clear(ProgramCollection<glu::ProgramSources> *this)

{
  ProgramSources *this_00;
  bool bVar1;
  pointer ppVar2;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>
  local_28;
  iterator local_20;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>
  local_18;
  const_iterator i;
  ProgramCollection<glu::ProgramSources> *this_local;
  
  i._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>_>
       ::begin(&this->m_programs);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>
  ::_Rb_tree_const_iterator(&local_18,&local_20);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>_>
         ::end(&this->m_programs);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>
    ::_Rb_tree_const_iterator(&local_28,&local_30);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>
             ::operator->(&local_18);
    this_00 = ppVar2->second;
    if (this_00 != (ProgramSources *)0x0) {
      glu::ProgramSources::~ProgramSources(this_00);
      operator_delete(this_00,0xd0);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>
    ::operator++(&local_18);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glu::ProgramSources_*>_>_>
  ::clear(&this->m_programs);
  return;
}

Assistant:

void ProgramCollection<Program>::clear (void)
{
	for (typename ProgramMap::const_iterator i = m_programs.begin(); i != m_programs.end(); ++i)
		delete i->second;
	m_programs.clear();
}